

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O1

void __thiscall
pbrt::ParameterDictionary::RenameParameter(ParameterDictionary *this,string *before,string *after)

{
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar1;
  size_t sVar2;
  size_t __n;
  int iVar3;
  long lVar4;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar5;
  string *psVar6;
  
  paVar1 = (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
            *)(this->params).ptr;
  sVar2 = (this->params).nStored;
  paVar5 = &(this->params).field_2;
  if (paVar1 != (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                 *)0x0) {
    paVar5 = paVar1;
  }
  if (sVar2 != 0) {
    lVar4 = 0;
    do {
      __n = *(size_t *)(*(long *)((long)paVar5 + lVar4) + 0x28);
      if (__n == before->_M_string_length) {
        psVar6 = (string *)(*(long *)((long)paVar5 + lVar4) + 0x20);
        if (__n != 0) {
          iVar3 = bcmp(*(void **)psVar6,(before->_M_dataplus)._M_p,__n);
          if (iVar3 != 0) goto LAB_00397ee6;
        }
        std::__cxx11::string::_M_assign(psVar6);
      }
LAB_00397ee6:
      lVar4 = lVar4 + 8;
    } while (sVar2 << 3 != lVar4);
  }
  return;
}

Assistant:

std::string ParameterDictionary::GetTexture(const std::string &name) const {
    for (const ParsedParameter *p : params) {
        if (p->name != name || p->type != "texture")
            continue;

        if (p->strings.empty())
            ErrorExit(&p->loc, "No string values provided for parameter \"%s\".", name);
        if (p->strings.size() > 1)
            ErrorExit(&p->loc, "More than one value provided for parameter \"%s\".",
                      name);
        p->lookedUp = true;
        return p->strings[0];
    }

    return "";
}